

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void plutovg_blend(plutovg_canvas_t *canvas,plutovg_span_buffer_t *span_buffer)

{
  plutovg_state_t *ppVar1;
  plutovg_paint_t *ppVar2;
  plutovg_paint_t pVar3;
  plutovg_surface_t *ppVar4;
  composition_function_t p_Var5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  _Bool _Var9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint32_t y;
  uint32_t uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  plutovg_color_t *color;
  plutovg_span_t *ppVar21;
  uint32_t *puVar22;
  uint32_t *puVar23;
  ulong in_R10;
  int iVar24;
  float *pfVar25;
  ulong uVar26;
  int xoff;
  int iVar27;
  int iVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  plutovg_span_t *local_2170;
  plutovg_span_t *local_2168;
  composition_function_t func;
  int image_height;
  int image_width;
  plutovg_span_t *local_2118;
  int local_20c8;
  uint buffer [1024];
  uint32_t buffer_2 [1024];
  
  if ((span_buffer->spans).size != 0) {
    ppVar1 = canvas->state;
    ppVar2 = ppVar1->paint;
    if (ppVar2 == (plutovg_paint_t *)0x0) {
      color = &ppVar1->color;
LAB_001370bd:
      plutovg_blend_color(canvas,color,span_buffer);
      return;
    }
    if (ppVar2->type == PLUTOVG_PAINT_TYPE_GRADIENT) {
      if (ppVar2[6].ref_count != 0) {
        buffer_2[6] = ppVar2[1].type;
        buffer_2._0_8_ = ppVar2[2];
        buffer_2._8_8_ = ppVar2[3];
        buffer_2._16_8_ = ppVar2[4];
        plutovg_matrix_multiply
                  ((plutovg_matrix_t *)buffer_2,(plutovg_matrix_t *)buffer_2,&ppVar1->matrix);
        _Var9 = plutovg_matrix_invert((plutovg_matrix_t *)buffer_2,(plutovg_matrix_t *)buffer_2);
        if (_Var9) {
          iVar27 = ppVar2[6].ref_count;
          fVar42 = ppVar1->opacity;
          pVar3 = ppVar2[5];
          uVar10 = premultiply_color_with_opacity((plutovg_color_t *)((long)pVar3 + 4),fVar42);
          fVar43 = *(float *)pVar3;
          lVar15 = 8;
          for (fVar31 = 0.0014648438; fVar31 <= fVar43; fVar31 = fVar31 + 0.0009765625) {
            buffer_2[lVar15] = uVar10;
            lVar15 = lVar15 + 1;
          }
          auVar41._0_8_ = (ulong)((int)lVar15 - 7);
          iVar13 = 1;
          if (1 < iVar27) {
            iVar13 = iVar27;
          }
          buffer_2[7] = uVar10;
          for (uVar26 = 0; uVar26 != iVar13 - 1; uVar26 = uVar26 + 1) {
            fVar43 = *(float *)((long)pVar3 + uVar26 * 0x14);
            fVar36 = *(float *)((long)pVar3 + (uVar26 * 5 + 5) * 4);
            if ((fVar43 != fVar36) || (y = uVar10, NAN(fVar43) || NAN(fVar36))) {
              pfVar25 = (float *)((long)pVar3 + uVar26 * 0x14);
              y = premultiply_color_with_opacity((plutovg_color_t *)(pfVar25 + 6),fVar42);
              fVar46 = pfVar25[5];
              for (auVar41._0_8_ = (ulong)(int)auVar41._0_8_;
                  (fVar31 < fVar46 && ((long)auVar41._0_8_ < 0x400));
                  auVar41._0_8_ = auVar41._0_8_ + 1) {
                uVar14 = (uint32_t)(long)((fVar31 - *pfVar25) * (1.0 / (fVar36 - fVar43)) * 255.0);
                uVar14 = INTERPOLATE_PIXEL(uVar10,0xff - uVar14,y,uVar14);
                buffer_2[auVar41._0_8_ + 7] = uVar14;
                fVar31 = fVar31 + 0.0009765625;
              }
            }
            uVar10 = y;
          }
          uVar10 = premultiply_color_with_opacity
                             ((plutovg_color_t *)((long)pVar3 + ((long)iVar27 * 5 + -4) * 4),fVar42)
          ;
          for (lVar15 = (long)(int)auVar41._0_8_; lVar15 < 0x400; lVar15 = lVar15 + 1) {
            buffer_2[lVar15 + 7] = uVar10;
          }
          fVar42 = (float)ppVar2[6].type;
          fVar43 = (float)ppVar2[7].ref_count;
          fVar31 = (float)ppVar2[8].ref_count;
          if (ppVar2[1].ref_count == 0) {
            fVar36 = (float)ppVar2[7].type - fVar42;
            fVar31 = fVar31 - fVar43;
            auVar41._0_8_ = CONCAT44(fVar31,fVar36);
            auVar41._8_8_ = 0;
            fVar31 = fVar36 * fVar36 + fVar31 * fVar31;
            fVar36 = 0.0;
            if ((fVar31 != 0.0) || (NAN(fVar31))) {
              auVar32._4_4_ = fVar31;
              auVar32._0_4_ = fVar31;
              auVar32._8_4_ = fVar31;
              auVar32._12_4_ = fVar31;
              auVar41 = divps(auVar41,auVar32);
              fVar36 = -auVar41._0_4_ * fVar42 - fVar43 * auVar41._4_4_;
            }
            ppVar4 = canvas->surface;
            p_Var5 = composition_table[ppVar1->op];
            local_20c8 = (span_buffer->spans).size;
            local_2170 = (span_buffer->spans).data;
            fVar42 = (float)(auVar41._0_8_ >> 0x20);
            while (bVar29 = local_20c8 != 0, local_20c8 = local_20c8 + -1, bVar29) {
              iVar27 = local_2170->x;
              for (iVar13 = local_2170->len; puVar23 = buffer, iVar13 != 0; iVar13 = iVar13 - iVar17
                  ) {
                iVar17 = 0x400;
                if (iVar13 < 0x400) {
                  iVar17 = iVar13;
                }
                fVar43 = 0.0;
                fVar46 = 0.0;
                if ((fVar31 != 0.0) || (NAN(fVar31))) {
                  fVar43 = (float)local_2170->y + 0.5;
                  image_height = (int)auVar41._0_8_;
                  fVar46 = (((float)buffer_2[2] * fVar43 +
                             ((float)iVar27 + 0.5) * (float)buffer_2[0] + (float)buffer_2[4]) *
                            (float)image_height +
                            (fVar43 * (float)buffer_2[3] +
                             ((float)iVar27 + 0.5) * (float)buffer_2[1] + (float)buffer_2[5]) *
                            fVar42 + fVar36) * 1023.0;
                  fVar43 = ((float)buffer_2[0] * (float)image_height + (float)buffer_2[1] * fVar42)
                           * 1023.0;
                }
                if (1e-05 <= ABS(fVar43)) {
                  fVar30 = (float)iVar17 * fVar43 + fVar46;
                  if ((4194303.0 <= fVar30) || (fVar30 <= -4194304.0)) {
                    for (; puVar23 < buffer + iVar17; puVar23 = puVar23 + 1) {
                      uVar10 = gradient_pixel((gradient_data_t *)buffer_2,fVar46 * 0.0009765625);
                      *puVar23 = uVar10;
                      fVar46 = fVar46 + fVar43;
                    }
                  }
                  else {
                    iVar28 = (int)(fVar46 * 256.0);
                    for (; puVar23 < buffer + iVar17; puVar23 = puVar23 + 1) {
                      uVar10 = gradient_pixel_fixed((gradient_data_t *)buffer_2,iVar28);
                      *puVar23 = uVar10;
                      iVar28 = iVar28 + (int)(fVar43 * 256.0);
                    }
                  }
                }
                else {
                  uVar10 = gradient_pixel_fixed((gradient_data_t *)buffer_2,(int)(fVar46 * 256.0));
                  plutovg_memfill32(puVar23,iVar17,uVar10);
                }
                (*p_Var5)((uint32_t *)
                          (ppVar4->data +
                          (long)iVar27 * 4 + (long)ppVar4->stride * (long)local_2170->y),iVar17,
                          buffer,(uint32_t)local_2170->coverage);
                iVar27 = iVar27 + iVar17;
              }
              local_2170 = local_2170 + 1;
            }
          }
          else {
            fVar36 = (float)ppVar2[8].type;
            fVar46 = (float)ppVar2[9].ref_count;
            ppVar4 = canvas->surface;
            p_Var5 = composition_table[ppVar1->op];
            fVar42 = fVar42 - fVar31;
            fVar43 = fVar43 - fVar36;
            fVar38 = (float)ppVar2[7].type - fVar46;
            fVar39 = (fVar38 * fVar38 - fVar42 * fVar42) - fVar43 * fVar43;
            iVar27 = (span_buffer->spans).size;
            local_2118 = (span_buffer->spans).data;
            fVar33 = 1.0 / (fVar39 + fVar39);
            fVar34 = fVar33 * fVar33;
            fVar30 = fVar39 * 4.0;
            while (bVar29 = iVar27 != 0, iVar27 = iVar27 + -1, bVar29) {
              iVar13 = local_2118->x;
              for (iVar17 = local_2118->len; puVar23 = buffer, iVar17 != 0; iVar17 = iVar17 - iVar28
                  ) {
                iVar28 = 0x400;
                if (iVar17 < 0x400) {
                  iVar28 = iVar17;
                }
                if ((fVar39 != 0.0) || (NAN(fVar39))) {
                  fVar40 = (float)local_2118->y + 0.5;
                  fVar35 = ((float)buffer_2[0] * ((float)iVar13 + 0.5) +
                           (float)buffer_2[2] * fVar40 + (float)buffer_2[4]) - fVar31;
                  fVar44 = (((float)iVar13 + 0.5) * (float)buffer_2[1] +
                           fVar40 * (float)buffer_2[3] + (float)buffer_2[5]) - fVar36;
                  fVar47 = fVar44 * fVar43 + fVar46 * fVar38 + fVar42 * fVar35;
                  fVar49 = (float)buffer_2[0] * fVar42 + fVar43 * (float)buffer_2[1];
                  fVar47 = fVar47 + fVar47;
                  fVar40 = (float)buffer_2[0] * (float)buffer_2[0] +
                           (float)buffer_2[1] * (float)buffer_2[1];
                  fVar49 = fVar49 + fVar49;
                  fVar45 = fVar44 * (float)buffer_2[1] + fVar35 * (float)buffer_2[0];
                  fVar48 = fVar47 * fVar33;
                  fVar35 = ((fVar46 * fVar46 - (fVar35 * fVar35 + fVar44 * fVar44)) * -fVar30 +
                           fVar47 * fVar47) * fVar34;
                  fVar44 = ((fVar45 + fVar45 + fVar40) * fVar30 +
                           fVar49 * (fVar47 + fVar47) + fVar49 * fVar49) * fVar34;
                  fVar40 = ((fVar40 + fVar40) * fVar30 + (fVar49 + fVar49) * fVar49) * fVar34;
                  if (0.0 < fVar39 && fVar46 == 0.0) {
                    for (; puVar23 < buffer + iVar28; puVar23 = puVar23 + 1) {
                      if (fVar35 < 0.0) {
                        fVar45 = sqrtf(fVar35);
                      }
                      else {
                        fVar45 = SQRT(fVar35);
                      }
                      uVar10 = gradient_pixel((gradient_data_t *)buffer_2,fVar45 - fVar48);
                      *puVar23 = uVar10;
                      fVar35 = fVar35 + fVar44;
                      fVar44 = fVar44 + fVar40;
                      fVar48 = fVar48 + fVar49 * fVar33;
                    }
                  }
                  else {
                    for (; puVar23 < buffer + iVar28; puVar23 = puVar23 + 1) {
                      uVar10 = 0;
                      if (fVar35 >= 0.0) {
                        if (fVar35 < 0.0) {
                          fVar45 = sqrtf(fVar35);
                        }
                        else {
                          fVar45 = SQRT(fVar35);
                        }
                        if (0.0 <= fVar38 * (fVar45 - fVar48) + fVar46) {
                          uVar10 = gradient_pixel((gradient_data_t *)buffer_2,fVar45 - fVar48);
                        }
                      }
                      *puVar23 = uVar10;
                      fVar35 = fVar35 + fVar44;
                      fVar44 = fVar44 + fVar40;
                      fVar48 = fVar48 + fVar49 * fVar33;
                    }
                  }
                }
                else {
                  plutovg_memfill32(puVar23,iVar28,0);
                }
                (*p_Var5)((uint32_t *)
                          (ppVar4->data +
                          (long)iVar13 * 4 + (long)ppVar4->stride * (long)local_2118->y),iVar28,
                          buffer,(uint32_t)local_2118->coverage);
                iVar13 = iVar13 + iVar28;
              }
              local_2118 = local_2118 + 1;
            }
          }
        }
      }
    }
    else {
      if (ppVar2->type == PLUTOVG_PAINT_TYPE_COLOR) {
        color = (plutovg_color_t *)(ppVar2 + 1);
        goto LAB_001370bd;
      }
      pVar3 = ppVar2[5];
      if (pVar3 != (plutovg_paint_t)0x0) {
        buffer._16_8_ = ppVar2[4];
        buffer._0_8_ = ppVar2[2];
        buffer._8_8_ = ppVar2[3];
        buffer._24_8_ = *(undefined8 *)((long)pVar3 + 0x10);
        buffer._32_8_ = *(undefined8 *)((long)pVar3 + 4);
        buffer[10] = *(uint *)((long)pVar3 + 0xc);
        lVar15 = lroundf(ppVar1->opacity * (float)ppVar2[1].type * 256.0);
        buffer[0xb] = (uint)lVar15;
        plutovg_matrix_multiply
                  ((plutovg_matrix_t *)buffer,(plutovg_matrix_t *)buffer,&ppVar1->matrix);
        _Var9 = plutovg_matrix_invert((plutovg_matrix_t *)buffer,(plutovg_matrix_t *)buffer);
        if (_Var9) {
          fVar42 = (float)buffer._0_8_;
          ppVar4 = canvas->surface;
          p_Var5 = composition_table[ppVar1->op];
          fVar43 = SUB84(buffer._0_8_,4);
          uVar7 = buffer[8];
          uVar8 = buffer[9];
          if (((fVar42 == 1.0) && (!NAN(fVar42))) && (fVar43 == 0.0)) {
            if (((float)buffer[2] == 0.0) && (!NAN((float)buffer[2]))) {
              if (((float)buffer[3] == 1.0) && (!NAN((float)buffer[3]))) {
                iVar27 = (int)(float)buffer[4];
                if (ppVar2[1].ref_count != 0) {
                  iVar27 = iVar27 % (int)buffer[8];
                  iVar17 = (int)(float)buffer[5] % (int)buffer[9];
                  uVar11 = iVar27 >> 0x1f & buffer[8];
                  uVar12 = iVar17 >> 0x1f & buffer[9];
                  iVar13 = (span_buffer->spans).size;
                  local_2168 = (span_buffer->spans).data;
                  while (bVar29 = iVar13 != 0, iVar13 = iVar13 + -1, bVar29) {
                    iVar28 = local_2168->x;
                    iVar24 = local_2168->len;
                    iVar16 = (int)(uVar11 + iVar27 + iVar28) % (int)uVar7;
                    iVar18 = (int)(local_2168->y + uVar12 + iVar17) % (int)uVar8;
                    iVar16 = (iVar16 >> 0x1f & uVar7) + iVar16;
                    iVar20 = local_2168->coverage * buffer[0xb];
                    while (iVar24 != 0) {
                      iVar19 = uVar7 - iVar16;
                      if (iVar24 <= (int)(uVar7 - iVar16)) {
                        iVar19 = iVar24;
                      }
                      if (0x3ff < iVar19) {
                        iVar19 = 0x400;
                      }
                      (*p_Var5)((uint32_t *)
                                (ppVar4->data +
                                (long)iVar28 * 4 + (long)ppVar4->stride * (long)local_2168->y),
                                iVar19,(uint32_t *)
                                       ((long)(int)buffer[10] *
                                        (long)(int)((iVar18 >> 0x1f & uVar8) + iVar18) +
                                        buffer._24_8_ + (long)iVar16 * 4),iVar20 >> 8);
                      iVar28 = iVar28 + iVar19;
                      iVar16 = iVar16 + iVar19;
                      iVar24 = iVar24 - iVar19;
                      if ((int)uVar7 <= iVar16) {
                        iVar16 = 0;
                      }
                    }
                    local_2168 = local_2168 + 1;
                  }
                  return;
                }
                iVar17 = (int)(float)buffer[5];
                iVar13 = (span_buffer->spans).size;
                ppVar21 = (span_buffer->spans).data;
                while (bVar29 = iVar13 != 0, iVar13 = iVar13 + -1, bVar29) {
                  lVar15 = (long)ppVar21->y + (long)iVar17;
                  iVar28 = (int)lVar15;
                  if ((-1 < iVar28) && (iVar28 < (int)uVar8)) {
                    uVar11 = ppVar21->x + iVar27;
                    if ((int)uVar11 < (int)uVar7) {
                      auVar41._0_8_ = 0;
                      if (0 < (int)uVar11) {
                        auVar41._0_8_ = (ulong)uVar11;
                      }
                      uVar12 = 0;
                      if ((int)uVar11 < 0) {
                        uVar12 = uVar11;
                      }
                      iVar24 = uVar12 + ppVar21->len;
                      iVar28 = uVar7 - (int)auVar41._0_8_;
                      if (iVar24 + (int)auVar41._0_8_ <= (int)uVar7) {
                        iVar28 = iVar24;
                      }
                      if (0 < iVar28) {
                        iVar24 = ppVar21->x;
                        if ((int)uVar11 < 0) {
                          iVar24 = -iVar27;
                        }
                        (*p_Var5)((uint32_t *)
                                  (ppVar4->data +
                                  (long)iVar24 * 4 + (long)ppVar4->stride * (long)ppVar21->y),iVar28
                                  ,(uint32_t *)
                                   ((int)buffer[10] * lVar15 + buffer._24_8_ + auVar41._0_8_ * 4),
                                  (int)(ppVar21->coverage * buffer[0xb]) >> 8);
                      }
                    }
                  }
                  ppVar21 = ppVar21 + 1;
                }
                return;
              }
            }
          }
          if (ppVar2[1].ref_count == 0) {
            iVar27 = (span_buffer->spans).size;
            ppVar21 = (span_buffer->spans).data;
            while (bVar29 = iVar27 != 0, iVar27 = iVar27 + -1, bVar29) {
              puVar23 = (uint32_t *)
                        (ppVar4->data +
                        (long)ppVar21->x * 4 + (long)ppVar4->stride * (long)ppVar21->y);
              fVar31 = (float)ppVar21->x + 0.5;
              fVar36 = (float)ppVar21->y + 0.5;
              iVar28 = (int)((fVar36 * (float)buffer._8_8_ + (float)buffer._0_8_ * fVar31 +
                             (float)buffer._16_8_) * 65536.0);
              iVar24 = (int)((fVar36 * SUB84(buffer._8_8_,4) + SUB84(buffer._0_8_,4) * fVar31 +
                             SUB84(buffer._16_8_,4)) * 65536.0);
              iVar17 = ppVar21->coverage * buffer[0xb];
              for (iVar13 = ppVar21->len; iVar13 != 0; iVar13 = iVar13 - iVar16) {
                iVar16 = 0x400;
                if (iVar13 < 0x400) {
                  iVar16 = iVar13;
                }
                for (puVar22 = buffer_2; puVar22 < buffer_2 + iVar16; puVar22 = puVar22 + 1) {
                  uVar11 = iVar28 >> 0x10;
                  iVar18 = iVar24 >> 0x10;
                  uVar10 = 0;
                  if (-1 < (int)uVar11) {
                    auVar37._0_4_ = -(uint)((int)uVar11 < (int)uVar7);
                    auVar37._4_4_ = auVar37._0_4_;
                    auVar37._8_4_ = -(uint)(iVar18 < (int)uVar8);
                    auVar37._12_4_ = -(uint)(iVar18 < (int)uVar8);
                    uVar12 = movmskpd((int)in_R10,auVar37);
                    in_R10 = (ulong)uVar12;
                    if ((byte)(-1 < iVar18 & (byte)uVar12 & (byte)uVar12 >> 1) == 1) {
                      uVar10 = *(uint32_t *)
                                ((long)iVar18 * (long)(int)buffer[10] + buffer._24_8_ +
                                (ulong)uVar11 * 4);
                    }
                  }
                  *puVar22 = uVar10;
                  iVar28 = iVar28 + (int)(fVar42 * 65536.0);
                  iVar24 = iVar24 + (int)(fVar43 * 65536.0);
                }
                (*p_Var5)(puVar23,iVar16,buffer_2,iVar17 >> 8);
                puVar23 = puVar23 + iVar16;
              }
              ppVar21 = ppVar21 + 1;
            }
          }
          else {
            iVar13 = (int)buffer[10] / 4;
            iVar27 = (span_buffer->spans).size;
            ppVar21 = (span_buffer->spans).data;
            while (uVar6 = buffer._24_8_, bVar29 = iVar27 != 0, iVar27 = iVar27 + -1, bVar29) {
              puVar23 = (uint32_t *)
                        (ppVar4->data +
                        (long)ppVar21->x * 4 + (long)ppVar4->stride * (long)ppVar21->y);
              fVar31 = (float)ppVar21->x + 0.5;
              fVar36 = (float)ppVar21->y + 0.5;
              iVar24 = (int)((fVar36 * (float)buffer._8_8_ + (float)buffer._0_8_ * fVar31 +
                             (float)buffer._16_8_) * 65536.0);
              iVar16 = (int)((fVar36 * SUB84(buffer._8_8_,4) + SUB84(buffer._0_8_,4) * fVar31 +
                             SUB84(buffer._16_8_,4)) * 65536.0);
              iVar28 = ppVar21->coverage * buffer[0xb];
              for (iVar17 = ppVar21->len; iVar17 != 0; iVar17 = iVar17 - iVar18) {
                iVar18 = 0x400;
                if (iVar17 < 0x400) {
                  iVar18 = iVar17;
                }
                for (puVar22 = buffer_2; puVar22 < buffer_2 + iVar18; puVar22 = puVar22 + 1) {
                  iVar20 = (iVar24 >> 0x10) % (int)uVar7;
                  iVar19 = (iVar16 >> 0x10) % (int)uVar8;
                  iVar20 = (iVar20 >> 0x1f & uVar7) + iVar20;
                  if ((iVar20 < 0) || ((int)uVar7 <= iVar20)) {
                    __assert_fail("px >= 0 && px < image_width",
                                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-blend.c"
                                  ,0x37e,
                                  "void blend_transformed_tiled_argb(plutovg_surface_t *, plutovg_operator_t, const texture_data_t *, const plutovg_span_buffer_t *)"
                                 );
                  }
                  iVar19 = (iVar19 >> 0x1f & uVar8) + iVar19;
                  if ((iVar19 < 0) || ((int)uVar8 <= iVar19)) {
                    __assert_fail("py >= 0 && py < image_height",
                                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-blend.c"
                                  ,0x37f,
                                  "void blend_transformed_tiled_argb(plutovg_surface_t *, plutovg_operator_t, const texture_data_t *, const plutovg_span_buffer_t *)"
                                 );
                  }
                  *puVar22 = *(uint32_t *)(uVar6 + (long)(iVar19 * iVar13 + iVar20) * 4);
                  iVar24 = iVar24 + (int)(fVar42 * 65536.0);
                  iVar16 = iVar16 + (int)(fVar43 * 65536.0);
                }
                (*p_Var5)(puVar23,iVar18,buffer_2,iVar28 >> 8);
                puVar23 = puVar23 + iVar18;
              }
              ppVar21 = ppVar21 + 1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void plutovg_blend(plutovg_canvas_t* canvas, const plutovg_span_buffer_t* span_buffer)
{
    if(span_buffer->spans.size == 0)
        return;
    if(canvas->state->paint == NULL) {
        plutovg_blend_color(canvas, &canvas->state->color, span_buffer);
        return;
    }

    plutovg_paint_t* paint = canvas->state->paint;
    if(paint->type == PLUTOVG_PAINT_TYPE_COLOR) {
        plutovg_solid_paint_t* solid = (plutovg_solid_paint_t*)(paint);
        plutovg_blend_color(canvas, &solid->color, span_buffer);
    } else if(paint->type == PLUTOVG_PAINT_TYPE_GRADIENT) {
        plutovg_gradient_paint_t* gradient = (plutovg_gradient_paint_t*)(paint);
        plutovg_blend_gradient(canvas, gradient, span_buffer);
    } else {
        plutovg_texture_paint_t* texture = (plutovg_texture_paint_t*)(paint);
        plutovg_blend_texture(canvas, texture, span_buffer);
    }
}